

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

Expr * __thiscall kratos::Generator::expr(Generator *this,ExprOp op,Var *left,Var *right)

{
  shared_ptr<kratos::Expr> sVar1;
  Var *local_40;
  ExprOp op_local;
  Var *left_local;
  Var *right_local;
  shared_ptr<kratos::Expr> expr;
  
  local_40 = (Var *)op;
  op_local = (ExprOp)left;
  left_local = right;
  sVar1 = std::make_shared<kratos::Expr,kratos::ExprOp&,kratos::Var*&,kratos::Var*&>
                    ((ExprOp *)&right_local,&local_40,(Var **)&op_local);
  std::
  _Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<kratos::Expr>&>
            ((_Hashtable<std::shared_ptr<kratos::Expr>,std::shared_ptr<kratos::Expr>,std::allocator<std::shared_ptr<kratos::Expr>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::Expr>>,std::hash<std::shared_ptr<kratos::Expr>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->exprs_,&right_local,
             sVar1.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr);
  return (Expr *)right_local;
}

Assistant:

Expr &Generator::expr(ExprOp op, Var *left, Var *right) {
    auto expr = std::make_shared<Expr>(op, left, right);
    exprs_.emplace(expr);
    return *expr;
}